

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O1

void __thiscall QGraphicsView::keyPressEvent(QGraphicsView *this,QKeyEvent *event)

{
  long lVar1;
  long lVar2;
  QObject *pQVar3;
  
  lVar1 = *(long *)(this + 8);
  lVar2 = *(long *)(lVar1 + 0x490);
  if ((((lVar2 != 0) && (*(int *)(lVar2 + 4) != 0)) && (*(long *)(lVar1 + 0x498) != 0)) &&
     ((*(byte *)(lVar1 + 0x300) & 1) != 0)) {
    if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
      pQVar3 = (QObject *)0x0;
    }
    else {
      pQVar3 = *(QObject **)(lVar1 + 0x498);
    }
    QCoreApplication::sendEvent(pQVar3,(QEvent *)event);
    if (event[0xc] != (QKeyEvent)0x0) {
      return;
    }
  }
  QAbstractScrollArea::keyPressEvent((QAbstractScrollArea *)this,event);
  return;
}

Assistant:

void QGraphicsView::keyPressEvent(QKeyEvent *event)
{
    Q_D(QGraphicsView);
    if (!d->scene || !d->sceneInteractionAllowed) {
        QAbstractScrollArea::keyPressEvent(event);
        return;
    }
    QCoreApplication::sendEvent(d->scene, event);
    if (!event->isAccepted())
        QAbstractScrollArea::keyPressEvent(event);
}